

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall
QCss::ValueExtractor::extractBackground
          (ValueExtractor *this,QBrush *brush,QString *image,Repeat *repeat,Alignment *alignment,
          Origin *origin,Attachment *attachment,Origin *clip)

{
  QPalette *pal;
  QPalette *pal_00;
  Property PVar1;
  Declaration *pDVar2;
  DeclarationData *pDVar3;
  _Head_base<0UL,_QBrushData_*,_false> _Var4;
  DataPtr DVar5;
  char16_t *pcVar6;
  QArrayData *pQVar7;
  QPalettePrivate *pQVar8;
  __uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter> _Var9;
  undefined1 auVar10 [8];
  Alignment AVar11;
  Repeat RVar12;
  Attachment AVar13;
  QFlagsStorage<Qt::AlignmentFlag> QVar14;
  quint64 qVar15;
  Attachment *pAVar16;
  ulong uVar17;
  QBrush *this_00;
  int iVar18;
  long lVar19;
  int iVar20;
  long in_FS_OFFSET;
  bool bVar21;
  BackgroundData data;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->declarations).d.size == 0) {
    bVar21 = false;
  }
  else {
    uVar17 = 0;
    bVar21 = false;
    do {
      pDVar2 = (this->declarations).d.ptr;
      pDVar3 = pDVar2[uVar17].d.d.ptr;
      if ((pDVar3->values).d.size == 0) goto LAB_005dc502;
      pal = (QPalette *)(pDVar2 + uVar17);
      PVar1 = pDVar3->propertyId;
      if (6 < PVar1 - Background) {
        if (PVar1 == BackgroundColor) {
          QPalette::QPalette((QPalette *)local_68);
          Declaration::brushValue((Declaration *)&local_88.shared,pal);
          _Var4._M_head_impl =
               (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
          (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
          super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
          super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_88.shared;
          local_88.shared = (PrivateShared *)_Var4._M_head_impl;
          QBrush::~QBrush((QBrush *)&local_88.shared);
          QPalette::~QPalette((QPalette *)local_68);
          goto LAB_005dbf26;
        }
        goto LAB_005dc502;
      }
      switch(PVar1) {
      case Background:
        if (*(ulong *)&(pDVar3->parsed).d.field_0x18 < 4) {
          local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          uStack_90 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QBrush::QBrush((QBrush *)local_98);
          uStack_90._0_4_ = 0x11;
          uStack_90._4_4_ = 0;
          pQVar8 = pal->d;
          QBrush::QBrush((QBrush *)local_68);
          auVar10 = local_98;
          local_68._8_8_ = (char16_t *)0x11;
          local_98 = (undefined1  [8])local_68._0_8_;
          local_68._0_8_ = auVar10;
          uStack_90 = (char16_t *)0x11;
          QBrush::~QBrush((QBrush *)local_68);
          pQVar7 = &((image->d).d)->super_QArrayData;
          (image->d).d = (Data *)0x0;
          (image->d).ptr = (char16_t *)0x0;
          (image->d).size = 0;
          if (pQVar7 != (QArrayData *)0x0) {
            LOCK();
            (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar7,2,0x10);
            }
          }
          *repeat = Repeat_XY;
          (alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
          super_QFlagsStorage<Qt::AlignmentFlag>.i = 0x21;
          if (pQVar8[1].data.d.ptr != (Data *)0x0) {
            lVar19 = 0;
            iVar18 = 0;
            do {
              pal_00 = (QPalette *)(*(long *)&pQVar8[1].detach_no + lVar19 * 0x28);
              if (*(int *)&pal_00->d == 6) {
                iVar20 = ::QVariant::toInt((bool *)&pal_00->currentGroup);
                if (iVar20 != 0x27) {
                  if ((*(int *)&pal_00->d == 6) &&
                     (iVar20 = ::QVariant::toInt((bool *)&pal_00->currentGroup), iVar20 == 0x28)) {
                    QBrush::QBrush((QBrush *)&local_88.shared,transparent,SolidPattern);
                    QBrush::QBrush((QBrush *)local_68,(QBrush *)&local_88.shared);
                    auVar10 = local_98;
                    local_68._8_8_ = (char16_t *)0x100000011;
                    local_98 = (undefined1  [8])local_68._0_8_;
                    local_68._0_8_ = auVar10;
                    uStack_90 = (char16_t *)0x100000011;
                    QBrush::~QBrush((QBrush *)local_68);
                    QBrush::~QBrush((QBrush *)&local_88.shared);
                  }
                  goto LAB_005dc283;
                }
                pQVar7 = &((image->d).d)->super_QArrayData;
                (image->d).d = (Data *)0x0;
                (image->d).ptr = (char16_t *)0x0;
                (image->d).size = 0;
                if (pQVar7 != (QArrayData *)0x0) {
                  LOCK();
                  (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
                       (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(pQVar7,2,0x10);
                  }
                }
              }
              else if (*(int *)&pal_00->d == 7) {
                ::QVariant::toString();
                _Var9._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
                     (tuple<QBrushData_*,_QBrushDataPointerDeleter>)(image->d).d;
                pcVar6 = (image->d).ptr;
                (image->d).d = (Data *)local_68._0_8_;
                (image->d).ptr = (char16_t *)local_68._8_8_;
                pQVar7 = (QArrayData *)(image->d).size;
                (image->d).size = (qsizetype)local_58[0];
                local_68._0_8_ =
                     _Var9._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
                local_68._8_8_ = pcVar6;
                local_58[0] = (undefined1 *)pQVar7;
                if ((__uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>)
                    _Var9._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>)0x0) {
                  LOCK();
                  *(int *)_Var9._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                          super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
                       (int)*(Type *)_Var9._M_t.
                                     super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                     super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + -1;
                  UNLOCK();
                  if ((__atomic_base<int>)
                      *(__int_type *)
                       _Var9._M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl ==
                      (__atomic_base<int>)0x0) {
                    QArrayData::deallocate
                              ((QArrayData *)
                               _Var9._M_t.
                               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,2,0x10);
                  }
                }
              }
              else {
LAB_005dc283:
                ::QVariant::toString();
                qVar15 = findKnownValue((QString *)local_68,repeats,5);
                if ((QBrushData *)local_68._0_8_ != (QBrushData *)0x0) {
                  LOCK();
                  *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
                  UNLOCK();
                  if (*(int *)local_68._0_8_ == 0) {
                    QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
                  }
                }
                if ((Repeat)qVar15 == Repeat_Unknown) {
                  if (*(int *)&pal_00->d == 6) {
                    iVar20 = 1;
                    if (lVar19 < (long)&pQVar8[1].data.d.ptr[-1].field_0x21f) {
                      bVar21 = *(int *)(*(long *)&pQVar8[1].detach_no + (long)(iVar18 + 1) * 0x28)
                               == 6;
                      iVar20 = iVar18 + 1;
                      if (!bVar21) {
                        iVar20 = iVar18;
                      }
                      iVar18 = iVar20;
                      iVar20 = bVar21 + 1;
                    }
                    QVar14.i = (Int)parseAlignment((Value *)(*(long *)&pQVar8[1].detach_no +
                                                            lVar19 * 0x28),iVar20);
                    if ((QFlagsStorage<Qt::AlignmentFlag>)QVar14.i !=
                        (QFlagsStorage<Qt::AlignmentFlag>)0x0) {
                      (alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
                      super_QFlagsStorage<Qt::AlignmentFlag>.i = QVar14.i;
                      goto LAB_005dc2ee;
                    }
                    iVar18 = (iVar18 - iVar20) + 1;
                  }
                  parseBrushValue((Value *)local_68,pal_00);
                  auVar10 = local_98;
                  local_98 = (undefined1  [8])local_68._0_8_;
                  uStack_90 = (char16_t *)local_68._8_8_;
                  local_68._0_8_ = auVar10;
                  QBrush::~QBrush((QBrush *)local_68);
                }
                else {
                  *repeat = (Repeat)qVar15;
                }
              }
LAB_005dc2ee:
              iVar18 = iVar18 + 1;
              lVar19 = (long)iVar18;
            } while (lVar19 < (long)pQVar8[1].data.d.ptr);
          }
          brushFromData((BrushData *)local_68,(QPalette *)local_98);
          _Var4._M_head_impl =
               (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
          (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
          super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
          super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_68._0_8_;
          local_68._0_8_ = _Var4._M_head_impl;
          QBrush::~QBrush((QBrush *)local_68);
          if (uStack_90._4_4_ != 3) {
            local_48 = &DAT_aaaaaaaaaaaaaaaa;
            uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
            local_58[0] = &DAT_aaaaaaaaaaaaaaaa;
            local_58[1] = &DAT_aaaaaaaaaaaaaaaa;
            local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QBrush::QBrush((QBrush *)local_68,(QBrush *)local_98);
            local_68._8_8_ = uStack_90;
            local_58[0] = (undefined1 *)(image->d).d;
            local_58[1] = (undefined1 *)(image->d).ptr;
            local_48 = (undefined1 *)(image->d).size;
            if ((QArrayData *)local_58[0] != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((QArrayData *)local_58[0])->ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((QArrayData *)local_58[0])->ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            uStack_40 = (undefined1 *)
                        CONCAT44((alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
                                 super_QFlagsStorage<Qt::AlignmentFlag>.i,*repeat);
            ::QVariant::QVariant((QVariant *)&local_88,(QMetaType)0x7f8298,local_68);
            ::QVariant::operator=((QVariant *)(pal->d + 2),(QVariant *)&local_88);
            ::QVariant::~QVariant((QVariant *)&local_88);
            if ((QArrayData *)local_58[0] != (QArrayData *)0x0) {
              LOCK();
              *(int *)local_58[0] = *(int *)local_58[0] + -1;
              UNLOCK();
              if (*(int *)local_58[0] == 0) {
                QArrayData::deallocate((QArrayData *)local_58[0],2,0x10);
              }
            }
            QBrush::~QBrush((QBrush *)local_68);
          }
          this_00 = (QBrush *)local_98;
        }
        else {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_58[0] = &DAT_aaaaaaaaaaaaaaaa;
          local_58[1] = &DAT_aaaaaaaaaaaaaaaa;
          local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          qvariant_cast<QCss::BackgroundData>((BackgroundData *)local_68,(QVariant *)(pal->d + 2));
          brushFromData((BrushData *)&local_88,(QPalette *)local_68);
          _Var4._M_head_impl =
               (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
          (brush->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
          super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
          super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_88.shared;
          local_88.shared = (PrivateShared *)_Var4._M_head_impl;
          QBrush::~QBrush((QBrush *)&local_88.shared);
          QString::operator=(image,(QString *)local_58);
          *repeat = (Repeat)uStack_40;
          (alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
          super_QFlagsStorage<Qt::AlignmentFlag>.i = (Int)uStack_40._4_4_;
          if ((QArrayData *)local_58[0] != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_58[0] = *(int *)local_58[0] + -1;
            UNLOCK();
            if (*(int *)local_58[0] == 0) {
              QArrayData::deallocate((QArrayData *)local_58[0],2,0x10);
            }
          }
          this_00 = (QBrush *)local_68;
        }
        QBrush::~QBrush(this_00);
        break;
      case BackgroundOrigin:
        AVar13 = Declaration::originValue((Declaration *)pal);
        pAVar16 = origin;
        goto LAB_005dbf24;
      case BackgroundClip:
        AVar13 = Declaration::originValue((Declaration *)pal);
        pAVar16 = clip;
        goto LAB_005dbf24;
      case BackgroundRepeat:
        if (*(ulong *)&(pDVar3->parsed).d.field_0x18 < 4) {
          ::QVariant::toString();
          qVar15 = findKnownValue((QString *)local_68,repeats,5);
          *repeat = (Repeat)qVar15;
          if ((QBrushData *)local_68._0_8_ != (QBrushData *)0x0) {
            LOCK();
            *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
            UNLOCK();
            if (*(int *)local_68._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
            }
          }
          ::QVariant::QVariant((QVariant *)local_68,*repeat);
          ::QVariant::operator=((QVariant *)(pal->d + 2),(QVariant *)local_68);
          ::QVariant::~QVariant((QVariant *)local_68);
        }
        else {
          RVar12 = ::QVariant::toInt((bool *)&pDVar3->parsed);
          *repeat = RVar12;
        }
        break;
      case BackgroundPosition:
        AVar11 = Declaration::alignmentValue((Declaration *)pal);
        (alignment->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
        super_QFlagsStorage<Qt::AlignmentFlag>.i = (Int)AVar11;
        goto LAB_005dbf26;
      case BackgroundAttachment:
        AVar13 = Declaration::attachmentValue((Declaration *)pal);
        pAVar16 = attachment;
LAB_005dbf24:
        *pAVar16 = AVar13;
LAB_005dbf26:
        bVar21 = true;
        goto LAB_005dc502;
      case BackgroundImage:
        bVar21 = true;
        if (((pDVar3->values).d.ptr)->type != Uri) goto LAB_005dc502;
        ::QVariant::toString();
        DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
             (__uniq_ptr_data<QBrushData,_QBrushDataPointerDeleter,_true,_true>)(image->d).d;
        pcVar6 = (image->d).ptr;
        (image->d).d = (Data *)local_68._0_8_;
        (image->d).ptr = (char16_t *)local_68._8_8_;
        pQVar7 = (QArrayData *)(image->d).size;
        (image->d).size = (qsizetype)local_58[0];
        local_68._0_8_ =
             DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        local_68._8_8_ = pcVar6;
        local_58[0] = (undefined1 *)pQVar7;
        if ((tuple<QBrushData_*,_QBrushDataPointerDeleter>)
            DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
            super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
            super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl !=
            (_Head_base<0UL,_QBrushData_*,_false>)0x0) {
          LOCK();
          *(int *)DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
               *(int *)DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + -1;
          UNLOCK();
          if (*(int *)DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl == 0) {
            QArrayData::deallocate
                      ((QArrayData *)
                       DVar5._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl,2,0x10);
          }
        }
      }
      bVar21 = true;
LAB_005dc502:
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)(this->declarations).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar21;
}

Assistant:

bool ValueExtractor::extractBackground(QBrush *brush, QString *image, Repeat *repeat,
                                       Qt::Alignment *alignment, Origin *origin, Attachment *attachment,
                                       Origin *clip)
{
    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        if (decl.d->values.isEmpty())
            continue;
        const QCss::Value &val = decl.d->values.at(0);
        switch (decl.d->propertyId) {
            case BackgroundColor:
                    *brush = decl.brushValue();
                break;
            case BackgroundImage:
                if (val.type == Value::Uri)
                    *image = val.variant.toString();
                break;
            case BackgroundRepeat:
                if (decl.d->parsed.isValid()) {
                    *repeat = static_cast<Repeat>(decl.d->parsed.toInt());
                } else {
                    *repeat = static_cast<Repeat>(findKnownValue(val.variant.toString(),
                                                  repeats, NumKnownRepeats));
                    decl.d->parsed = *repeat;
                }
                break;
            case BackgroundPosition:
                *alignment = decl.alignmentValue();
                break;
            case BackgroundOrigin:
                *origin = decl.originValue();
                break;
            case BackgroundClip:
                *clip = decl.originValue();
                break;
            case Background:
                if (decl.d->parsed.isValid()) {
                    BackgroundData data = qvariant_cast<BackgroundData>(decl.d->parsed);
                    *brush = brushFromData(data.brush, pal);
                    *image = data.image;
                    *repeat = data.repeat;
                    *alignment = data.alignment;
                } else {
                    BrushData brushData;
                    parseShorthandBackgroundProperty(decl.d->values, &brushData, image, repeat, alignment, pal);
                    *brush = brushFromData(brushData, pal);
                    if (brushData.type != BrushData::DependsOnThePalette) {
                        BackgroundData data = { brushData, *image, *repeat, *alignment };
                        decl.d->parsed = QVariant::fromValue<BackgroundData>(data);
                    }
                }
                break;
            case BackgroundAttachment:
                *attachment = decl.attachmentValue();
                break;
            default: continue;
        }
        hit = true;
    }
    return hit;
}